

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgtextelement.cpp
# Opt level: O2

void lunasvg::handleTextChunk(SVGTextFragmentIterator begin,SVGTextFragmentIterator end)

{
  char cVar1;
  Direction DVar2;
  TextAnchor TVar3;
  bool bVar4;
  SVGTextFragment *fragment;
  SVGTextFragmentIterator SVar5;
  ulong uVar6;
  SVGTextFragmentIterator it_1;
  SVGTextFragment *pSVar7;
  SVGTextFragment *fragment_3;
  SVGTextFragmentIterator it_2;
  ulong uVar8;
  float fVar9;
  float fVar10;
  Transform lengthAdjustTransform;
  LengthContext lengthContext;
  
  bVar4 = SVGElement::hasAttribute((SVGElement *)(begin._M_current)->element,TextLength);
  if (bVar4) {
    fVar10 = 0.0;
    uVar8 = 0;
    pSVar7 = (SVGTextFragment *)0x0;
    for (SVar5._M_current = begin._M_current; SVar5._M_current != end._M_current;
        SVar5._M_current = SVar5._M_current + 1) {
      fVar10 = fVar10 + (SVar5._M_current)->width;
      if (pSVar7 != (SVGTextFragment *)0x0) {
        fVar10 = fVar10 + ((SVar5._M_current)->x - (pSVar7->x + pSVar7->width));
      }
      uVar8 = uVar8 + (SVar5._M_current)->length;
      pSVar7 = SVar5._M_current;
    }
    lengthContext.m_element = (SVGElement *)(begin._M_current)->element;
    lengthContext.m_units = UserSpaceOnUse;
    fVar9 = LengthContext::valueForLength
                      (&lengthContext,
                       &((SVGTextPositioningElement *)lengthContext.m_element)->m_textLength);
    if ((0.0 < fVar9) && (0.0 < fVar10)) {
      cVar1 = ((begin._M_current)->element->m_lengthAdjust).super_SVGProperty.field_0x9;
      if (cVar1 == '\x01') {
        Transform::translated(&lengthAdjustTransform,(begin._M_current)->x,(begin._M_current)->y);
        Transform::scale(&lengthAdjustTransform,fVar9 / fVar10,1.0);
        Transform::translate(&lengthAdjustTransform,-(begin._M_current)->x,-(begin._M_current)->y);
        for (SVar5._M_current = begin._M_current; SVar5._M_current != end._M_current;
            SVar5._M_current = SVar5._M_current + 1) {
          ((SVar5._M_current)->lengthAdjustTransform).m_matrix.e = lengthAdjustTransform.m_matrix.e;
          ((SVar5._M_current)->lengthAdjustTransform).m_matrix.f = lengthAdjustTransform.m_matrix.f;
          ((SVar5._M_current)->lengthAdjustTransform).m_matrix.a = lengthAdjustTransform.m_matrix.a;
          ((SVar5._M_current)->lengthAdjustTransform).m_matrix.b = lengthAdjustTransform.m_matrix.b;
          ((SVar5._M_current)->lengthAdjustTransform).m_matrix.c = lengthAdjustTransform.m_matrix.c;
          ((SVar5._M_current)->lengthAdjustTransform).m_matrix.d = lengthAdjustTransform.m_matrix.d;
        }
      }
      else if (1 < uVar8) {
        if (cVar1 != '\0') {
          __assert_fail("firstFragment.element->lengthAdjust() == LengthAdjust::Spacing",
                        "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/source/svgtextelement.cpp"
                        ,0xa5,
                        "void lunasvg::handleTextChunk(SVGTextFragmentIterator, SVGTextFragmentIterator)"
                       );
        }
        uVar6 = 0;
        for (SVar5._M_current = begin._M_current; SVar5._M_current != end._M_current;
            SVar5._M_current = SVar5._M_current + 1) {
          (SVar5._M_current)->x =
               (float)uVar6 * ((fVar9 - fVar10) / (float)(uVar8 - 1)) + (SVar5._M_current)->x;
          uVar6 = uVar6 + (SVar5._M_current)->length;
        }
      }
    }
  }
  DVar2 = (begin._M_current)->element->m_direction;
  TVar3 = (begin._M_current)->element->m_text_anchor;
  if (TVar3 == Start) {
    if (DVar2 != Rtl) {
      return;
    }
  }
  else if (TVar3 != Middle) {
    if (TVar3 != End) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/source/svgtextelement.cpp"
                    ,0x6b,
                    "bool lunasvg::needsTextAnchorAdjustment(const SVGTextPositioningElement *)");
    }
    if (DVar2 != Ltr) {
      return;
    }
  }
  fVar10 = 0.0;
  pSVar7 = (SVGTextFragment *)0x0;
  for (SVar5._M_current = begin._M_current; SVar5._M_current != end._M_current;
      SVar5._M_current = SVar5._M_current + 1) {
    fVar10 = fVar10 + (SVar5._M_current)->width;
    if (pSVar7 != (SVGTextFragment *)0x0) {
      fVar10 = fVar10 + ((SVar5._M_current)->x - (pSVar7->x + pSVar7->width));
    }
    pSVar7 = SVar5._M_current;
  }
  if (TVar3 == End) {
    fVar9 = 0.0;
    if (DVar2 != Ltr) goto LAB_0011e237;
  }
  else {
    if (TVar3 == Middle) {
      fVar9 = fVar10 * -0.5;
      goto LAB_0011e237;
    }
    if (TVar3 != Start) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/source/svgtextelement.cpp"
                    ,0x80,
                    "float lunasvg::calculateTextAnchorOffset(const SVGTextPositioningElement *, float)"
                   );
    }
    if (DVar2 == Ltr) {
      fVar9 = 0.0;
      goto LAB_0011e237;
    }
  }
  fVar9 = -fVar10;
LAB_0011e237:
  for (; begin._M_current != end._M_current; begin._M_current = begin._M_current + 1) {
    (begin._M_current)->x = (begin._M_current)->x + fVar9;
  }
  return;
}

Assistant:

static void handleTextChunk(SVGTextFragmentIterator begin, SVGTextFragmentIterator end)
{
    const SVGTextFragment& firstFragment = *begin;
    if(firstFragment.element->hasAttribute(PropertyID::TextLength)) {
        float chunkWidth = 0;
        size_t numCharacters = 0;
        const SVGTextFragment* lastFragment = nullptr;
        for(auto it = begin; it != end; ++it) {
            const SVGTextFragment& fragment = *it;
            numCharacters += fragment.length;
            chunkWidth += fragment.width;
            if(lastFragment)
                chunkWidth += fragment.x - (lastFragment->x + lastFragment->width);
            lastFragment = &fragment;
        }

        LengthContext lengthContext(firstFragment.element);
        auto textLength = lengthContext.valueForLength(firstFragment.element->textLength());
        if(textLength > 0.f && chunkWidth > 0.f) {
            if(firstFragment.element->lengthAdjust() == LengthAdjust::SpacingAndGlyphs) {
                auto textLengthScale = textLength / chunkWidth;
                auto lengthAdjustTransform = Transform::translated(firstFragment.x, firstFragment.y);
                lengthAdjustTransform.scale(textLengthScale, 1.f);
                lengthAdjustTransform.translate(-firstFragment.x, -firstFragment.y);
                for(auto it = begin; it != end; ++it) {
                    SVGTextFragment& fragment = *it;
                    fragment.lengthAdjustTransform = lengthAdjustTransform;
                }
            } else if(numCharacters > 1) {
                assert(firstFragment.element->lengthAdjust() == LengthAdjust::Spacing);
                size_t characterOffset = 0;
                auto textLengthShift = (textLength - chunkWidth) / (numCharacters - 1);
                for(auto it = begin; it != end; ++it) {
                    SVGTextFragment& fragment = *it;
                    fragment.x += textLengthShift * characterOffset;
                    characterOffset += fragment.length;
                }
            }
        }
    }

    if(needsTextAnchorAdjustment(firstFragment.element)) {
        float chunkWidth = 0;
        const SVGTextFragment* lastFragment = nullptr;
        for(auto it = begin; it != end; ++it) {
            const SVGTextFragment& fragment = *it;
            chunkWidth += fragment.width;
            if(lastFragment)
                chunkWidth += fragment.x - (lastFragment->x + lastFragment->width);
            lastFragment = &fragment;
        }

        auto chunkOffset = calculateTextAnchorOffset(firstFragment.element, chunkWidth);
        for(auto it = begin; it != end; ++it) {
            SVGTextFragment& fragment = *it;
            fragment.x += chunkOffset;
        }
    }
}